

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::Arguments::~Arguments(Arguments *this)

{
  bool bVar1;
  iterator this_00;
  reference ppcVar2;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *in_RDI;
  iterator i;
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffffd8;
  
  this_00 = std::vector<char_*,_std::allocator<char_*>_>::begin(in_stack_ffffffffffffffd8);
  while( true ) {
    std::vector<char_*,_std::allocator<char_*>_>::end(in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                               *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *
                        )&stack0xfffffffffffffff0);
    free(*ppcVar2);
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
               &stack0xfffffffffffffff0);
  }
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)this_00._M_current);
  return;
}

Assistant:

~Arguments() {
    for (std::vector<char*>::iterator i = args_.begin(); i != args_.end();
         ++i) {
      free(*i);
    }
  }